

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::Y_formatter<spdlog::details::scoped_padder>::format
          (Y_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint value;
  long lVar3;
  format_decimal_result<char_*> fVar4;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  scoped_padder::scoped_padder(&local_60,4,&(this->super_flag_formatter).padinfo_,dest);
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  value = -uVar1;
  if (0 < (int)uVar1) {
    value = uVar1;
  }
  fVar4 = fmt::v10::detail::format_decimal<char,unsigned_int>(local_38,value,0x15);
  local_20 = fVar4.begin;
  if (iVar2 < -0x76c) {
    local_20[-1] = '-';
    local_20 = local_20 + -1;
  }
  lVar3 = (long)local_38 - (long)local_20;
  if (-0x16 < lVar3) {
    fmt::v10::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,local_20 + lVar3 + 0x15);
    scoped_padder::~scoped_padder(&local_60);
    return;
  }
  fmt::v10::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
             ,0x189,"negative value");
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }